

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::block_statement::print(block_statement *this,wostream *os)

{
  wostream *pwVar1;
  size_type sVar2;
  const_reference this_00;
  syntax_node *sn;
  char *pcVar3;
  ulong local_20;
  size_t i;
  wostream *os_local;
  block_statement *this_local;
  
  pwVar1 = std::operator<<(os,"block_statement{");
  pcVar3 = "non-strict";
  if ((this->strict_mode_ & 1U) != 0) {
    pcVar3 = "strict";
  }
  pwVar1 = std::operator<<(pwVar1,pcVar3);
  std::operator<<(pwVar1,", {");
  local_20 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
            ::size(&this->l_);
    if (sVar2 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(os,", ");
    }
    this_00 = std::
              vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
              ::operator[](&this->l_,local_20);
    sn = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*(this_00)
          ->super_syntax_node;
    mjs::operator<<(os,sn);
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"}}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "block_statement{" << (strict_mode_ ? "strict" : "non-strict") << ", {";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << *l_[i];
        }
        os << "}}";
    }